

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall kratos::SSATransformFixVisitor::visit(SSATransformFixVisitor *this,Generator *gen)

{
  pointer *value_str;
  element_type *this_00;
  bool bVar1;
  undefined1 auVar2 [8];
  undefined1 local_78 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  shared_ptr<kratos::Stmt> local_50;
  undefined1 local_40 [8];
  shared_ptr<kratos::StmtBlock> blk_stmt;
  
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         local_78,&gen->stmts_);
  if (local_78 !=
      (undefined1  [8])
      stmts.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    value_str = &stmts.
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar2 = local_78;
    do {
      this_00 = (((pointer)auVar2)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      if (this_00->type_ == Block) {
        stmts.
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)value_str,"ssa","");
        bVar1 = IRNode::has_attribute(&this_00->super_IRNode,(string *)value_str);
        if (stmts.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_50) {
          operator_delete(stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)((long)&((local_50.
                                           super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_IRNode)._vptr_IRNode + 1));
        }
      }
      else {
        bVar1 = false;
      }
      if (bVar1 != false) {
        Stmt::as<kratos::StmtBlock>((Stmt *)local_40);
        if (*(StatementBlockType *)((long)local_40 + 0xd8) == Combinational) {
          process_always_comb((shared_ptr<kratos::StmtBlock> *)local_40);
        }
        if (blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      auVar2 = (undefined1  [8])((long)auVar2 + 0x10);
    } while (auVar2 != (undefined1  [8])
                       stmts.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          local_78);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmts = gen->get_all_stmts();
        for (auto const &stmt : stmts) {
            if (stmt->type() == StatementType::Block && stmt->has_attribute("ssa")) {
                auto blk_stmt = stmt->as<StmtBlock>();
                if (blk_stmt->block_type() == StatementBlockType::Combinational) {
                    process_always_comb(blk_stmt);
                }
            }
        }
    }